

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

bool __thiscall
banksia::ChessBoard::isLegalMove(ChessBoard *this,int from,int dest,PieceType promotion)

{
  pointer pPVar1;
  bool bVar2;
  ulong uVar3;
  PieceType in_R9D;
  Side side;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moveList;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> local_38;
  
  if ((uint)(dest | from) < 0x40 && from != dest) {
    pPVar1 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(this->super_BoardCore).pieces.
                  super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pPVar1 >> 3;
    if (uVar3 <= (uint)from) {
LAB_0017d83a:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if (pPVar1[(uint)from].type != empty) {
      if (uVar3 <= (uint)dest) goto LAB_0017d83a;
      side = pPVar1[(uint)from].side;
      if ((side != pPVar1[(uint)dest].side) &&
         (bVar2 = BoardCore::isValidPromotion(promotion), bVar2)) {
        local_38.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        genLegal(this,&local_38,side,from,dest,in_R9D);
        bVar2 = local_38.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_38.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        if (local_38.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          return bVar2;
        }
        operator_delete(local_38.
                        super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool ChessBoard::isLegalMove(int from, int dest, PieceType promotion)
{
    if (!MoveFull::isValid(from, dest)) {
        return false;
    }
    auto piece = getPiece(from);
    if (piece.isEmpty()
        || piece.side == getPiece(dest).side
        || !isValidPromotion(promotion)) {
        return false;
    }
    
    std::vector<MoveFull> moveList;
    genLegal(moveList, piece.side, from, dest, promotion);
    return !moveList.empty();
}